

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::InternReadFile
          (COBImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  bool bVar1;
  int iVar2;
  StreamReader<false,_false> *this_00;
  IOStream *stream_00;
  pointer pSVar3;
  Logger *this_01;
  basic_formatter *this_02;
  iterator *this_03;
  mapped_type *this_04;
  size_type sVar4;
  size_type sVar5;
  aiMesh **__s;
  aiMaterial **__s_00;
  element_type *peVar6;
  aiLight **__s_01;
  aiCamera **__s_02;
  pointer pNVar7;
  Node *pNVar8;
  __shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  Node *pNVar10;
  element_type *peVar11;
  aiNode *paVar12;
  ulong uVar13;
  undefined1 local_4d8 [8];
  FlipWindingOrderProcess flip;
  Node *mm;
  size_t m;
  element_type *local_4a0;
  Node *nn;
  size_t n_3;
  unique_ptr<Assimp::COB::Node,_std::default_delete<Assimp::COB::Node>_> root;
  shared_ptr<Assimp::COB::Node> *n_2;
  iterator __end1_2;
  iterator __begin1_2;
  NodeList *__range1_2;
  Mesh *mesh_1;
  shared_ptr<Assimp::COB::Node> *n_1;
  iterator __end1_1;
  iterator __begin1_1;
  NodeList *__range1_1;
  reference local_3d8;
  Face *f;
  iterator __end3;
  iterator __begin3;
  vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *__range3;
  Mesh *mesh;
  shared_ptr<Assimp::COB::Node> *n;
  iterator __end1;
  iterator __begin1;
  NodeList *__range1;
  string local_358;
  allocator local_331;
  string local_330;
  allocator local_309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  string local_170;
  allocator local_149;
  string local_148;
  char local_128 [8];
  char head [32];
  string local_100;
  unique_ptr<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
  local_d0;
  unique_ptr<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
  stream;
  Scene scene;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  COBImporter *this_local;
  
  COB::Scene::Scene((Scene *)&stream);
  this_00 = (StreamReader<false,_false> *)operator_new(0x38);
  head[0x1e] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"rb",(allocator *)(head + 0x1f));
  stream_00 = IOSystem::Open(pIOHandler,pFile,&local_100);
  StreamReader<false,_false>::StreamReader(this_00,stream_00,false);
  head[0x1e] = '\0';
  std::
  unique_ptr<Assimp::StreamReader<false,false>,std::default_delete<Assimp::StreamReader<false,false>>>
  ::unique_ptr<std::default_delete<Assimp::StreamReader<false,false>>,void>
            ((unique_ptr<Assimp::StreamReader<false,false>,std::default_delete<Assimp::StreamReader<false,false>>>
              *)&local_d0,this_00);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)(head + 0x1f));
  pSVar3 = std::
           unique_ptr<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
           ::operator->(&local_d0);
  StreamReader<false,_false>::CopyAndAdvance(pSVar3,local_128,0x20);
  iVar2 = strncmp(local_128,"Caligari ",9);
  if (iVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_148,"Could not found magic id: `Caligari`",&local_149);
    ThrowException(&local_148);
  }
  this_01 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[18]>(&local_2e8,(char (*) [18])"File format tag: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_308,head + 1,6,&local_309);
  this_02 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_2e8,&local_308);
  Formatter::basic_formatter::operator_cast_to_string(&local_170,this_02);
  Logger::info(this_01,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_2e8);
  if (head[8] == 'L') {
    if (head[7] == 'A') {
      pSVar3 = std::
               unique_ptr<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
               ::get(&local_d0);
      ReadAsciiFile(this,(Scene *)&stream,pSVar3);
    }
    else {
      pSVar3 = std::
               unique_ptr<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
               ::get(&local_d0);
      ReadBinaryFile(this,(Scene *)&stream,pSVar3);
    }
    bVar1 = std::
            deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
            ::empty((deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                     *)&stream);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_358,"No nodes loaded",(allocator *)((long)&__range1 + 7));
      ThrowException(&local_358);
    }
    std::
    deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
    ::begin((iterator *)&__end1._M_node,
            (deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             *)&stream);
    std::
    deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
    ::end((iterator *)&n,
          (deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           *)&stream);
    while (bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&n), bVar1) {
      p_Var9 = &std::
                _Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
                ::operator*((_Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
                             *)&__end1._M_node)->
                super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>;
      peVar6 = std::__shared_ptr_access<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)p_Var9);
      if (peVar6->type == TYPE_MESH) {
        peVar11 = std::__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var9);
        this_03 = &peVar11[1].temp_children.
                   super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                   ._M_impl.super__Deque_impl_data._M_start;
        __end3 = std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::begin
                           ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)this_03
                           );
        f = (Face *)std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::end
                              ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)
                               this_03);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<Assimp::COB::Face_*,_std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>_>
                                           *)&f), bVar1) {
          local_3d8 = __gnu_cxx::
                      __normal_iterator<Assimp::COB::Face_*,_std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>_>
                      ::operator*(&__end3);
          this_04 = std::
                    map<unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>_>_>
                    ::operator[]((map<unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>_>_>
                                  *)&peVar11[1].temp_children.
                                     super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                                     ._M_impl.super__Deque_impl_data._M_finish,&local_3d8->material)
          ;
          __range1_1 = (NodeList *)local_3d8;
          std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>::push_back
                    (this_04,(value_type *)&__range1_1);
          __gnu_cxx::
          __normal_iterator<Assimp::COB::Face_*,_std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>_>
          ::operator++(&__end3);
        }
      }
      std::
      _Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
      ::operator++((_Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
                    *)&__end1._M_node);
    }
    std::
    deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
    ::begin((iterator *)&__end1_1._M_node,
            (deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             *)&stream);
    std::
    deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
    ::end((iterator *)&n_1,
          (deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           *)&stream);
    while (bVar1 = std::operator!=((_Self *)&__end1_1._M_node,(_Self *)&n_1), bVar1) {
      p_Var9 = &std::
                _Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
                ::operator*((_Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
                             *)&__end1_1._M_node)->
                super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>;
      peVar6 = std::__shared_ptr_access<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)p_Var9);
      if (peVar6->type == TYPE_MESH) {
        peVar11 = std::__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var9);
        sVar4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           &peVar11[1].type);
        if ((sVar4 != 0) &&
           (sVar4 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                              ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                               (peVar11 + 1)), sVar4 != 0)) {
          sVar5 = std::
                  map<unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>_>_>
                  ::size((map<unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>_>_>
                          *)&peVar11[1].temp_children.
                             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                             ._M_impl.super__Deque_impl_data._M_finish);
          pScene->mNumMeshes = (int)sVar5 + pScene->mNumMeshes;
        }
      }
      std::
      _Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
      ::operator++((_Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
                    *)&__end1_1._M_node);
    }
    uVar13 = (ulong)pScene->mNumMeshes << 3;
    __s = (aiMesh **)operator_new__(uVar13);
    memset(__s,0,uVar13);
    pScene->mMeshes = __s;
    uVar13 = (ulong)pScene->mNumMeshes << 3;
    __s_00 = (aiMaterial **)operator_new__(uVar13);
    memset(__s_00,0,uVar13);
    pScene->mMaterials = __s_00;
    pScene->mNumMeshes = 0;
    std::
    deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
    ::begin((iterator *)&__end1_2._M_node,
            (deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             *)&stream);
    std::
    deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
    ::end((iterator *)&n_2,
          (deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           *)&stream);
    while (bVar1 = std::operator!=((_Self *)&__end1_2._M_node,(_Self *)&n_2), bVar1) {
      root._M_t.super___uniq_ptr_impl<Assimp::COB::Node,_std::default_delete<Assimp::COB::Node>_>.
      _M_t.super__Tuple_impl<0UL,_Assimp::COB::Node_*,_std::default_delete<Assimp::COB::Node>_>.
      super__Head_base<0UL,_Assimp::COB::Node_*,_false>._M_head_impl =
           (__uniq_ptr_data<Assimp::COB::Node,_std::default_delete<Assimp::COB::Node>,_true,_true>)
           std::
           _Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
           ::operator*((_Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
                        *)&__end1_2._M_node);
      peVar6 = std::__shared_ptr_access<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)root._M_t.
                               super___uniq_ptr_impl<Assimp::COB::Node,_std::default_delete<Assimp::COB::Node>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Assimp::COB::Node_*,_std::default_delete<Assimp::COB::Node>_>
                               .super__Head_base<0UL,_Assimp::COB::Node_*,_false>._M_head_impl);
      if (peVar6->type == TYPE_LIGHT) {
        pScene->mNumLights = pScene->mNumLights + 1;
      }
      else {
        peVar6 = std::
                 __shared_ptr_access<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)root._M_t.
                               super___uniq_ptr_impl<Assimp::COB::Node,_std::default_delete<Assimp::COB::Node>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Assimp::COB::Node_*,_std::default_delete<Assimp::COB::Node>_>
                               .super__Head_base<0UL,_Assimp::COB::Node_*,_false>._M_head_impl);
        if (peVar6->type == TYPE_CAMERA) {
          pScene->mNumCameras = pScene->mNumCameras + 1;
        }
      }
      std::
      _Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
      ::operator++((_Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
                    *)&__end1_2._M_node);
    }
    if (pScene->mNumLights != 0) {
      uVar13 = (ulong)pScene->mNumLights << 3;
      __s_01 = (aiLight **)operator_new__(uVar13);
      memset(__s_01,0,uVar13);
      pScene->mLights = __s_01;
    }
    if (pScene->mNumCameras != 0) {
      uVar13 = (ulong)pScene->mNumCameras << 3;
      __s_02 = (aiCamera **)operator_new__(uVar13);
      memset(__s_02,0,uVar13);
      pScene->mCameras = __s_02;
    }
    pScene->mNumCameras = 0;
    pScene->mNumLights = 0;
    pNVar7 = (pointer)operator_new(0xd8);
    COB::Group::Group((Group *)pNVar7);
    std::unique_ptr<Assimp::COB::Node,std::default_delete<Assimp::COB::Node>>::
    unique_ptr<std::default_delete<Assimp::COB::Node>,void>
              ((unique_ptr<Assimp::COB::Node,std::default_delete<Assimp::COB::Node>> *)&n_3,pNVar7);
    for (nn = (Node *)0x0; pNVar10 = nn,
        pNVar8 = (Node *)std::
                         deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                         ::size((deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                                 *)&stream), pNVar10 < pNVar8;
        nn = (Node *)((long)&nn->_vptr_Node + 1)) {
      p_Var9 = &std::
                deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ::operator[]((deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                              *)&stream,(size_type)nn)->
                super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>;
      local_4a0 = std::__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var9);
      if ((local_4a0->super_ChunkInfo).parent_id == 0) {
        pNVar7 = std::unique_ptr<Assimp::COB::Node,_std::default_delete<Assimp::COB::Node>_>::
                 operator->((unique_ptr<Assimp::COB::Node,_std::default_delete<Assimp::COB::Node>_>
                             *)&n_3);
        m = (size_t)local_4a0;
        std::deque<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>::push_back
                  (&pNVar7->temp_children,(value_type *)&m);
      }
      for (mm = nn; pNVar10 = (Node *)std::
                                      deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                                      ::size((deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                                              *)&stream), mm < pNVar10;
          mm = (Node *)((long)&mm->_vptr_Node + 1)) {
        p_Var9 = &std::
                  deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                  ::operator[]((deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                                *)&stream,(size_type)mm)->
                  super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>;
        peVar11 = std::__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var9);
        if ((peVar11->super_ChunkInfo).parent_id == (local_4a0->super_ChunkInfo).id) {
          flip.super_BaseProcess.progress = (ProgressHandler *)peVar11;
          std::deque<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>::
          push_back(&local_4a0->temp_children,(value_type *)&flip.super_BaseProcess.progress);
        }
      }
    }
    pNVar7 = std::unique_ptr<Assimp::COB::Node,_std::default_delete<Assimp::COB::Node>_>::get
                       ((unique_ptr<Assimp::COB::Node,_std::default_delete<Assimp::COB::Node>_> *)
                        &n_3);
    paVar12 = BuildNodes(this,pNVar7,(Scene *)&stream,pScene);
    pScene->mRootNode = paVar12;
    FlipWindingOrderProcess::FlipWindingOrderProcess((FlipWindingOrderProcess *)local_4d8);
    FlipWindingOrderProcess::Execute((FlipWindingOrderProcess *)local_4d8,pScene);
    FlipWindingOrderProcess::~FlipWindingOrderProcess((FlipWindingOrderProcess *)local_4d8);
    std::unique_ptr<Assimp::COB::Node,_std::default_delete<Assimp::COB::Node>_>::~unique_ptr
              ((unique_ptr<Assimp::COB::Node,_std::default_delete<Assimp::COB::Node>_> *)&n_3);
    std::
    unique_ptr<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
    ::~unique_ptr(&local_d0);
    COB::Scene::~Scene((Scene *)&stream);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_330,"File is big-endian, which is not supported",&local_331);
  ThrowException(&local_330);
}

Assistant:

void COBImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    COB::Scene scene;
    std::unique_ptr<StreamReaderLE> stream(new StreamReaderLE( pIOHandler->Open(pFile,"rb")) );

    // check header
    char head[32];
    stream->CopyAndAdvance(head,32);
    if (strncmp(head,"Caligari ",9) != 0) {
        ThrowException("Could not found magic id: `Caligari`");
    }

    ASSIMP_LOG_INFO_F("File format tag: ",std::string(head+9,6));
    if (head[16]!='L') {
        ThrowException("File is big-endian, which is not supported");
    }

    // load data into intermediate structures
    if (head[15]=='A') {
        ReadAsciiFile(scene, stream.get());
    }
    else {
        ReadBinaryFile(scene, stream.get());
    }
    if(scene.nodes.empty()) {
        ThrowException("No nodes loaded");
    }

    // sort faces by material indices
    for(std::shared_ptr< Node >& n : scene.nodes) {
        if (n->type == Node::TYPE_MESH) {
            Mesh& mesh = (Mesh&)(*n.get());
            for(Face& f : mesh.faces) {
                mesh.temp_map[f.material].push_back(&f);
            }
        }
    }

    // count meshes
    for(std::shared_ptr< Node >& n : scene.nodes) {
        if (n->type == Node::TYPE_MESH) {
            Mesh& mesh = (Mesh&)(*n.get());
            if (mesh.vertex_positions.size() && mesh.texture_coords.size()) {
                pScene->mNumMeshes += static_cast<unsigned int>(mesh.temp_map.size());
            }
        }
    }
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes]();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMeshes]();
    pScene->mNumMeshes = 0;

    // count lights and cameras
    for(std::shared_ptr< Node >& n : scene.nodes) {
        if (n->type == Node::TYPE_LIGHT) {
            ++pScene->mNumLights;
        }
        else if (n->type == Node::TYPE_CAMERA) {
            ++pScene->mNumCameras;
        }
    }

    if (pScene->mNumLights) {
        pScene->mLights  = new aiLight*[pScene->mNumLights]();
    }
    if (pScene->mNumCameras) {
        pScene->mCameras = new aiCamera*[pScene->mNumCameras]();
    }
    pScene->mNumLights = pScene->mNumCameras = 0;

    // resolve parents by their IDs and build the output graph
    std::unique_ptr<Node> root(new Group());
    for(size_t n = 0; n < scene.nodes.size(); ++n) {
        const Node& nn = *scene.nodes[n].get();
        if(nn.parent_id==0) {
            root->temp_children.push_back(&nn);
        }

        for(size_t m = n; m < scene.nodes.size(); ++m) {
            const Node& mm = *scene.nodes[m].get();
            if (mm.parent_id == nn.id) {
                nn.temp_children.push_back(&mm);
            }
        }
    }

    pScene->mRootNode = BuildNodes(*root.get(),scene,pScene);
	//flip normals after import
    FlipWindingOrderProcess flip;
    flip.Execute( pScene );
}